

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmatch.cpp
# Opt level: O3

bool __thiscall Lmatch::getMatch(Lmatch *this,Pattern *pg,Graph *dg,Graph *dest)

{
  ulong *puVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer psVar4;
  byte bVar5;
  undefined4 uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  pointer pNVar9;
  pointer pNVar10;
  ostream *poVar11;
  uint uVar12;
  pointer piVar13;
  pointer pNVar14;
  long lVar15;
  long lVar16;
  _Rb_tree_color _Var17;
  pointer pNVar18;
  ulong uVar19;
  _Alloc_hider _Var20;
  _Base_ptr p_Var21;
  Pattern *pPVar22;
  size_type __n;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> q;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  edgeMatch;
  Kmatrix km;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  allocator_type local_252;
  allocator_type local_251;
  Pattern *local_250;
  undefined1 local_248 [8];
  undefined1 *local_240;
  _Bit_type *local_238;
  undefined1 local_230 [16];
  _Rb_tree_color local_220 [2];
  undefined1 *local_218;
  _Bit_type *local_210;
  undefined1 local_208 [16];
  Graph *local_1f8;
  _Base_ptr local_1f0;
  _Base_ptr local_1e8;
  string local_1e0;
  string local_1c0;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_1a0;
  Kmatrix local_188;
  string local_168;
  vector<bool,_std::allocator<bool>_> local_148;
  Node local_120;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_e0;
  Node local_b0;
  Node local_70;
  
  local_188.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.M.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = dest;
  iVar7 = Pattern::getT(pg);
  Kmatrix::calMatrix(&local_188,&pg->super_Graph,dg,iVar7);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248._0_4_ = local_248._0_4_ & 0xffffff00;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_148,
             (long)(int)((ulong)((long)(pg->super_Graph).nodes.
                                       super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(pg->super_Graph).nodes.
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 6),(bool *)local_248,
             (allocator_type *)local_220);
  __n = (size_type)
        (int)((ulong)((long)(pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 6);
  local_220[0] = CONCAT31(local_220[0]._1_3_,1);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_248,__n,(bool *)local_220,&local_251);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&local_1a0,__n,(value_type *)local_248,&local_252);
  if ((void *)CONCAT44(local_248._4_4_,local_248._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_248._4_4_,local_248._0_4_));
  }
  pNVar10 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar9 = (pg->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_250 = pg;
  if (0 < (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6)) {
    lVar15 = 0;
    do {
      psVar4 = (local_250->super_Graph).edges.
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var21 = &psVar4[lVar15]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var8 = *(_Base_ptr *)((long)&psVar4[lVar15]._M_t._M_impl.super__Rb_tree_header + 0x10);
      if (p_Var8 != p_Var21) {
        do {
          local_248._0_4_ = p_Var8[1]._M_color;
          local_240 = local_230;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,p_Var8[1]._M_parent,
                     (long)&(p_Var8[1]._M_parent)->_M_color + (long)&(p_Var8[1]._M_left)->_M_color);
          _Var17 = local_248._0_4_ + 0x3f;
          if (-1 < (long)(int)local_248._0_4_) {
            _Var17 = local_248._0_4_;
          }
          bVar5 = (byte)local_248._0_4_ & 0x3f;
          puVar1 = local_1a0.
                   super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar15].
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_p +
                   (long)((int)_Var17 >> 6) +
                   (ulong)(((long)(int)local_248._0_4_ & 0x800000000000003fU) < 0x8000000000000001)
                   + 0xffffffffffffffff;
          *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != p_Var21);
        pNVar10 = (local_250->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pNVar9 = (local_250->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      pPVar22 = local_250;
      lVar15 = lVar15 + 1;
      iVar7 = (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6);
    } while (lVar15 < iVar7);
    if (0 < iVar7) {
      piVar13 = (local_250->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        if (piVar13[lVar15] == -1) {
          iVar7 = Pattern::getT(pPVar22);
          piVar13 = (pPVar22->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar13[lVar15] = iVar7 + 1;
          pNVar10 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pNVar9 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        lVar15 = lVar15 + 1;
        iVar7 = (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6);
      } while (lVar15 < iVar7);
      if (0 < iVar7) {
        pNVar14 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pNVar18 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar23 = 0;
        do {
          local_248._0_4_ = _S_red;
          if (0 < (int)((ulong)((long)pNVar18 - (long)pNVar14) >> 6)) {
            do {
              if ((local_250->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar23] <=
                  local_188.M.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar23].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[(int)local_248._0_4_]) {
                local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [uVar23 >> 6 & 0x3ffffff] =
                     local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [uVar23 >> 6 & 0x3ffffff] | 1L << ((byte)uVar23 & 0x3f);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_e0,(int *)local_248);
                pNVar14 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pNVar18 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              }
              local_248._0_4_ = local_248._0_4_ + _S_black;
            } while ((int)local_248._0_4_ < (int)((ulong)((long)pNVar18 - (long)pNVar14) >> 6));
            pNVar10 = (local_250->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pNVar9 = (local_250->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar23 = uVar23 + 1;
        } while ((long)uVar23 < (long)(int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6));
      }
    }
  }
  pPVar22 = local_250;
  p_Var2 = &local_e0._M_impl.super__Rb_tree_header;
  p_Var8 = local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_e0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    do {
      Graph::insertNode(local_1f8,
                        (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)p_Var8[1]._M_color);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var2);
    pNVar10 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    pNVar9 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (0 < (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6)) {
    lVar15 = 0;
    do {
      psVar4 = (pPVar22->super_Graph).edges.
               super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1f0 = &psVar4[lVar15]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var8 = *(_Base_ptr *)((long)&psVar4[lVar15]._M_t._M_impl.super__Rb_tree_header + 0x10);
      if (p_Var8 != local_1f0) {
        do {
          local_248._0_4_ = p_Var8[1]._M_color;
          local_240 = local_230;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,p_Var8[1]._M_parent,
                     (long)&(p_Var8[1]._M_parent)->_M_color + (long)&(p_Var8[1]._M_left)->_M_color);
          pNVar10 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pNVar9 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_1e8 = p_Var8;
          if (0 < (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6)) {
            lVar16 = 0;
            do {
              psVar4 = (dg->edges).
                       super__Vector_base<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              p_Var21 = &psVar4[lVar16]._M_t._M_impl.super__Rb_tree_header._M_header;
              p_Var8 = *(_Base_ptr *)
                        ((long)&psVar4[lVar16]._M_t._M_impl.super__Rb_tree_header + 0x10);
              if (p_Var8 != p_Var21) {
                do {
                  local_220[0] = p_Var8[1]._M_color;
                  local_218 = local_208;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_218,p_Var8[1]._M_parent,
                             (long)&(p_Var8[1]._M_parent)->_M_color +
                             (long)&(p_Var8[1]._M_left)->_M_color);
                  uVar6 = local_248._0_4_;
                  piVar13 = (pPVar22->weight).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if ((((piVar13[lVar15] <=
                         local_188.M.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar15].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16]) &&
                       (uVar23 = (ulong)(int)local_248._0_4_,
                       piVar13[uVar23] <=
                       local_188.M.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar23].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(int)local_220[0]])) && (local_238 == local_210)) &&
                     ((local_238 == (_Bit_type *)0x0 ||
                      (iVar7 = bcmp(local_240,local_218,(size_t)local_238), iVar7 == 0)))) {
                    _Var17 = uVar6 + 0x3f;
                    if (-1 < (int)uVar6) {
                      _Var17 = uVar6;
                    }
                    puVar1 = local_1a0.
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar15].
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                             (long)((int)_Var17 >> 6) +
                             (ulong)((uVar23 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
                    *puVar1 = *puVar1 | 1L << ((byte)uVar6 & 0x3f);
                    pNVar10 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    _Var20._M_p = pNVar10[lVar16].id._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1c0,_Var20._M_p,
                               _Var20._M_p + pNVar10[lVar16].id._M_string_length);
                    pNVar10 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                    _Var20._M_p = pNVar10[(int)local_220[0]].id._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1e0,_Var20._M_p,
                               _Var20._M_p + pNVar10[(int)local_220[0]].id._M_string_length);
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_168,local_218,
                               (undefined1 *)((long)local_210 + (long)local_218));
                    Graph::insertEdge(local_1f8,&local_1c0,&local_1e0,&local_168);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                      operator_delete(local_1e0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p);
                    }
                  }
                  if (local_218 != local_208) {
                    operator_delete(local_218);
                  }
                  p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
                  pPVar22 = local_250;
                } while (p_Var8 != p_Var21);
                pNVar10 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pNVar9 = (dg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < (int)((ulong)((long)pNVar9 - (long)pNVar10) >> 6));
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_1e8);
        } while (p_Var8 != local_1f0);
        pNVar10 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pNVar9 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar15 = lVar15 + 1;
      uVar12 = (uint)((ulong)((long)pNVar9 - (long)pNVar10) >> 6);
    } while (lVar15 < (int)uVar12);
    if (0 < (int)uVar12) {
      uVar23 = (ulong)(uVar12 & 0x7fffffff);
      uVar24 = 0;
      bVar25 = false;
      do {
        if ((local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar24 >> 6 & 0x3ffffff] >> (uVar24 & 0x3f) & 1)
            == 0) {
          paVar3 = &local_70.id.field_2;
          _Var20._M_p = pNVar10[uVar24].id._M_dataplus._M_p;
          local_70.id._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,_Var20._M_p,
                     _Var20._M_p + pNVar10[uVar24].id._M_string_length);
          local_70.num = pNVar10[uVar24].num;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_70.labels,&pNVar10[uVar24].labels);
          poVar11 = operator<<((ostream *)&std::cout,&local_70);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_70.labels);
          _Var20._M_p = local_70.id._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70.id._M_dataplus._M_p != paVar3) {
LAB_0010b8bb:
            operator_delete(_Var20._M_p);
          }
          goto LAB_0010b8c0;
        }
        lVar15 = 0x28;
        uVar19 = 0;
        do {
          if ((local_1a0.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar24].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p[uVar19 >> 6 & 0x3ffffff] >> (uVar19 & 0x3f) & 1) == 0)
          {
            local_120.id._M_dataplus._M_p = (pointer)&local_120.id.field_2;
            _Var20._M_p = pNVar10[uVar24].id._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,_Var20._M_p,
                       _Var20._M_p + pNVar10[uVar24].id._M_string_length);
            local_120.num = pNVar10[uVar24].num;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_120.labels,&pNVar10[uVar24].labels);
            poVar11 = operator<<((ostream *)&std::cout,&local_120);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," --->>> ",8);
            pNVar10 = (pPVar22->super_Graph).nodes.super__Vector_base<Node,_std::allocator<Node>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar3 = &local_b0.id.field_2;
            lVar16 = *(long *)((long)pNVar10 + lVar15 + -0x28);
            local_b0.id._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,lVar16,*(long *)((long)pNVar10 + lVar15 + -0x20) + lVar16
                      );
            local_b0.num = *(int *)((long)pNVar10 + lVar15 + -8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_b0.labels,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&(pNVar10->id)._M_dataplus._M_p + lVar15));
            poVar11 = operator<<(poVar11,&local_b0);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
            std::ostream::put((char)poVar11);
            std::ostream::flush();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b0.labels);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0.id._M_dataplus._M_p != paVar3) {
              operator_delete(local_b0.id._M_dataplus._M_p);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_120.labels);
            _Var20._M_p = local_120.id._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120.id._M_dataplus._M_p == &local_120.id.field_2) goto LAB_0010b8c0;
            goto LAB_0010b8bb;
          }
          uVar19 = uVar19 + 1;
          lVar15 = lVar15 + 0x40;
        } while (uVar23 != uVar19);
        uVar24 = uVar24 + 1;
        bVar25 = uVar23 <= uVar24;
      } while (uVar24 != uVar23);
    }
  }
  bVar25 = true;
LAB_0010b8c0:
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_1a0);
  if (local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_e0);
  Kmatrix::~Kmatrix(&local_188);
  return bVar25;
}

Assistant:

bool Lmatch::getMatch(Pattern &pg, Graph &dg, Graph &dest) {
    Kmatrix km;

    km.calMatrix(pg, dg, pg.getT());

    set<int> nodes;

    vector<bool> nodeMatch(pg.nodeNum(), false);
    vector<vector<bool>> edgeMatch(pg.nodeNum(), vector<bool>(pg.nodeNum(), true));
    for (int i = 0; i < pg.nodeNum(); i++) {
        for (auto p : pg.edges[i])
            edgeMatch[i][p.first] = false;
    }

    for (int i = 0; i < pg.nodeNum(); i++)
        if (pg.weight[i] == -1)
            pg.weight[i] = pg.getT() + 1;

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (int j = 0; j < dg.nodeNum(); j++) {
            if (km.M[i][j] >= pg.weight[i]) {
                nodeMatch[i] = true;
                nodes.insert(j);
            }
        }
    }

    for (int i : nodes) {
        dest.insertNode(dg.nodes[i]);
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (pair<int, string> p : pg.edges[i]) {
            for (int j = 0; j < dg.nodeNum(); j++) {
                for (pair<int, string> q : dg.edges[j]) {
                    if (km.M[i][j] >= pg.weight[i] && km.M[p.first][q.first] >= pg.weight[p.first]
                            && p.second == q.second) {
                        edgeMatch[i][p.first] = true;
                        dest.insertEdge(dg.nodes[j].id, dg.nodes[q.first].id, q.second);
                    }
                }
            }
        }
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        if (nodeMatch[i] == false) {
            cout << pg.nodes[i] << endl;
            return false;
        }
        for (int j = 0; j < pg.nodeNum(); j++) {
            if (edgeMatch[i][j] == false) {
                cout << pg.nodes[i] << " --->>> " << pg.nodes[j] << endl;
                return false;
            }
        }
    }
    return true;
}